

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_banded.c
# Opt level: O2

parasail_result_t *
parasail_nw_banded(char *_s1,int s1Len,char *_s2,int s2Len,int open,int gap,int k,
                  parasail_matrix_t *matrix)

{
  uint uVar1;
  parasail_result_t *ppVar2;
  int *ptr;
  int *ptr_00;
  int *b;
  int *b_00;
  int iVar3;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  char *__format;
  long lVar12;
  size_t size;
  int iVar14;
  long lVar13;
  
  if (_s1 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar7 = "_s1";
  }
  else if (s1Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar7 = "s1Len";
  }
  else if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar7 = "_s2";
  }
  else {
    uVar6 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar7 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar7 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar7 = "gap";
    }
    else if (k < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar7 = "k";
    }
    else {
      if (matrix != (parasail_matrix_t *)0x0) {
        ppVar2 = parasail_result_new();
        if (ppVar2 != (parasail_result_t *)0x0) {
          ppVar2->flag = ppVar2->flag | 0x1400181;
          ptr = parasail_memalign_int(0x10,(ulong)(uint)s1Len);
          ptr_00 = parasail_memalign_int(0x10,uVar6);
          if (ptr_00 != (int *)0x0 && ptr != (int *)0x0) {
            uVar11 = (s1Len - s2Len) - k;
            uVar1 = uVar11;
            if ((uint)s2Len < (uint)s1Len) {
              uVar11 = -k;
              uVar1 = (s2Len - s1Len) - k;
            }
            iVar14 = k - uVar1;
            size = (size_t)(iVar14 + 3);
            b = parasail_memalign_int(0x10,size);
            if ((b != (int *)0x0) && (b_00 = parasail_memalign_int(0x10,size), b_00 != (int *)0x0))
            {
              parasail_memset_int(b,0,size);
              parasail_memset_int(b_00,0,size);
              piVar5 = matrix->mapper;
              for (uVar10 = 0; (uint)s1Len != uVar10; uVar10 = uVar10 + 1) {
                ptr[uVar10] = piVar5[(byte)_s1[uVar10]];
              }
              piVar5 = matrix->mapper;
              for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
                ptr_00[uVar10] = piVar5[(byte)_s2[uVar10]];
              }
              iVar8 = -open;
              for (lVar4 = (long)(int)(1 - uVar11); lVar4 <= iVar14; lVar4 = lVar4 + 1) {
                b[lVar4 + 1] = iVar8;
                b_00[lVar4 + 1] = -0x40000000;
                iVar8 = iVar8 - gap;
              }
              b[(long)(int)~uVar11 + 1] = -open;
              b_00[(long)(int)~uVar11 + 1] = -0x40000000;
              b[(long)(int)-uVar11 + 1] = 0;
              b_00[(long)(int)-uVar11 + 1] = -0x40000000;
              *b = -0x40000000;
              *b_00 = -0x40000000;
              b[(long)(iVar14 + 1) + 1] = -0x40000000;
              b_00[(long)(iVar14 + 1) + 1] = -0x40000000;
              lVar4 = (long)(int)uVar11;
              piVar5 = ptr + lVar4;
              for (uVar10 = 0; uVar10 != uVar6; uVar10 = uVar10 + 1) {
                if (lVar4 < 0) {
                  b[(ulong)~(uint)lVar4 + 1] = -open - (int)uVar10 * gap;
                }
                iVar8 = -0x40000000;
                lVar12 = 0;
                while (lVar13 = lVar12, lVar12 = lVar13 + 1, lVar13 <= iVar14) {
                  if ((uVar11 + (int)lVar12) - 1 < (uint)s1Len) {
                    if (matrix->type == 0) {
                      iVar9 = piVar5[lVar13];
                    }
                    else {
                      iVar9 = uVar11 + (int)lVar12 + -1;
                    }
                    iVar3 = b[lVar12] +
                            matrix->matrix[(long)(matrix->size * iVar9) + (long)ptr_00[uVar10]];
                    iVar8 = iVar8 - gap;
                    iVar9 = b_00[lVar13 + 2] - gap;
                    if (b_00[lVar13 + 2] - gap < b[lVar13 + 2] - open) {
                      iVar9 = b[lVar13 + 2] - open;
                    }
                    if (iVar8 < b[lVar13] - open) {
                      iVar8 = b[lVar13] - open;
                    }
                    b_00[lVar12] = iVar9;
                    if (iVar9 <= iVar8) {
                      iVar9 = iVar8;
                    }
                    if (iVar9 <= iVar3) {
                      iVar9 = iVar3;
                    }
                    b[lVar12] = iVar9;
                  }
                }
                lVar4 = lVar4 + 1;
                piVar5 = piVar5 + 1;
                uVar11 = uVar11 + 1;
              }
              uVar6 = (ulong)(uint)k;
              if ((uint)s2Len < (uint)s1Len) {
                uVar6 = (long)(int)-uVar1;
              }
              ppVar2->score = b[uVar6 + 1];
              ppVar2->end_query = s1Len + -1;
              ppVar2->end_ref = s2Len + -1;
              parasail_free(b_00);
              parasail_free(b);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar2;
            }
          }
        }
        return (parasail_result_t *)0x0;
      }
      __format = "%s: missing %s\n";
      pcVar7 = "matrix";
    }
  }
  fprintf(_stderr,__format,"parasail_nw_banded",pcVar7);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const int k,
        const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * HB = NULL;
    int * H = NULL;
    int * EB = NULL;
    int * E = NULL;
    int i = 0;
    int j = 0;
    int low = 0;
    int colLen = 0;
    int colOff = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s1);
    PARASAIL_CHECK_GT0(s1Len);
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_GT0(k);
    PARASAIL_CHECK_NULL(matrix);

    /* initialize stack variables */

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_BANDED
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initalize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;

    low = s1Len - s2Len - k;
    if (s1Len > s2Len) {
        low = s2Len - s1Len - k;
    }
    colLen = k-low+1;
    colOff = s1Len > s2Len ? -k : low;

    HB = parasail_memalign_int(16, colLen+2);
    if (!HB) return NULL;
    H = HB+1;
    EB = parasail_memalign_int(16, colLen+2);
    if (!EB) return NULL;
    E = EB+1;
    parasail_memset_int(HB, 0, colLen+2);
    parasail_memset_int(EB, 0, colLen+2);

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

#ifdef PARASAIL_TABLE
    /* fill the table with zeros */
    {
        int limit = s1Len*s2Len;
        for (i=0; i<limit; ++i) {
            result->tables->score_table[i] = 0;
        }
    }
#endif

    /* initialize H */
    /* initialize E */
    for (i=-colOff+1,j=0; i<colLen; ++i, ++j) {
        H[i] = -open - j*gap;
        E[i] = NEG_INF_32;
    }
    H[-colOff-1] = -open;
    E[-colOff-1] = NEG_INF_32;
    H[-colOff] = 0;
    E[-colOff] = NEG_INF_32;
    H[-1] = NEG_INF_32;
    E[-1] = NEG_INF_32;
    H[colLen] = NEG_INF_32;
    E[colLen] = NEG_INF_32;

    /* iter over db */
    for (j=0; j<s2Len; ++j) {
        /* substitution matrix row (really we wanted a column) */
        int F = NEG_INF_32;
        if (colOff < 0) {
            H[-colOff-1] = -open - j*gap;
        }
        /* iter over query */
        for (i=0; i<colLen; ++i) {
            int pos = 0;
            int H_dag = 0;
            int E_opn = 0;
            int E_ext = 0;
            int F_opn = 0;
            int F_ext = 0;
            int matval = 0;
            pos = colOff+i;
            if (pos < 0 || pos >= s1Len) {
                continue;
            }
            matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                     matrix->matrix[matrix->size*s1[pos]+s2[j]] :
                     matrix->matrix[matrix->size*pos+s2[j]];
            H_dag = H[i] + matval;
            E_opn = H[i+1] - open;
            E_ext = E[i+1] - gap;
            F_opn = H[i-1] - open;
            F_ext = F - gap;
            E[i] = MAX(E_opn, E_ext);
            F = MAX(F_opn, F_ext);
            H[i] = MAX(E[i], F);
            H[i] = MAX(H[i], H_dag);
#ifdef PARASAIL_TABLE
            result->tables->score_table[pos*s2Len + j] = H[i];
#endif
        }
        colOff += 1;
    }

    result->score = s1Len > s2Len ? H[-low] : H[k];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;

    parasail_free(EB);
    parasail_free(HB);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}